

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<unsigned_char,_std::allocator<unsigned_char>_> *buf)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  uchar *b;
  byte *pbVar4;
  ios state;
  ios aiStack_138 [264];
  
  cVar3 = std::ios::fill();
  std::ios::ios(aiStack_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)aiStack_138);
  pbVar1 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar2 = 0;
  for (pbVar4 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::ios::copyfmt((ios *)(os + *(long *)(*(long *)os + -0x18)));
    if (!(bool)(~bVar2 & 1 | cVar3 == '\0')) {
      std::operator<<(os,cVar3);
    }
    std::ostream::operator<<(os,(uint)*pbVar4);
    bVar2 = 1;
  }
  std::ios_base::~ios_base((ios_base *)aiStack_138);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const std::vector<T, A>& buf)
{
    auto fillchar = os.fill();
    std::ios state(NULL);  state.copyfmt(os);

    bool first= true;
    for (const auto& b : buf) {
        os.copyfmt(state);
        if (!first && fillchar) os << fillchar;
        if constexpr (std::is_integral_v<T> && sizeof(T)==1) {
            // This makes sure the numbers in byte and char vectors are printed 
            // as numbers, instead of as characters.
            os << +b;
        }
        else {
            os << b;
        }
        first= false;
    }
    return os;
}